

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

double __thiscall soinn::ESOINN::densityThershold(ESOINN *this,double mean,double max)

{
  undefined8 local_28;
  double threshold;
  double max_local;
  double mean_local;
  ESOINN *this_local;
  
  if (mean * 2.0 < max) {
    if ((mean * 3.0 < max) || (max <= mean * 2.0)) {
      local_28 = 1.0;
    }
    else {
      local_28 = 0.5;
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double ESOINN::densityThershold(double mean, double max)
{
    double threshold;
    if(2.0 * mean >= max)
    {
        threshold = 0.0;
    }
    else if(3.0 * mean >= max && max > 2.0 * mean)
    {
        threshold = 0.5;
    }
    else
    {
        threshold = 1.0;
    }
    return threshold;
}